

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_mm_comp(jit_State *J,RecordIndex *ix,int op)

{
  TRef TVar1;
  ulong uVar2;
  TValue TVar3;
  bool bVar4;
  int iVar5;
  TRef TVar6;
  MMS mm;
  TValue mo1v;
  TValue local_38;
  
  ix->tab = ix->val;
  ix->tabv = ix->valv;
  do {
    mm = MM_le - ((op & 2U) == 0);
    iVar5 = lj_record_mm_lookup(J,ix,mm);
    if (iVar5 == 0) {
      if ((op & 2U) != 0) goto LAB_00150f43;
LAB_00150ff2:
      bVar4 = false;
    }
    else {
      TVar1 = ix->mobj;
      local_38 = ix->mobjv;
      uVar2 = (ix->keyv).u64;
      if ((uVar2 & 0xffff800000000000) == 0xfff9800000000000) {
        if (ix->mtv == *(GCtab **)((uVar2 & 0x7fffffffffff) + 0x20)) {
          (J->fold).ins.field_0.op1 = (IRRef1)ix->key;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b000b;
          goto LAB_00150fa6;
        }
LAB_00150ef6:
        ix->tab = ix->key;
        (ix->tabv).u64 = uVar2;
        iVar5 = lj_record_mm_lookup(J,ix,mm);
        if ((iVar5 != 0) &&
           (iVar5 = lj_record_objcmp(J,TVar1,ix->mobj,&local_38,&ix->mobjv), iVar5 == 0))
        goto LAB_00150fd5;
        bVar4 = false;
      }
      else {
        if (((uVar2 & 0xffff800000000000) != 0xfffa000000000000) ||
           (ix->mtv != *(GCtab **)((uVar2 & 0x7fffffffffff) + 0x20))) goto LAB_00150ef6;
        (J->fold).ins.field_0.op1 = (IRRef1)ix->key;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0005;
LAB_00150fa6:
        TVar6 = lj_opt_fold(J);
        TVar1 = ix->mt;
        (J->fold).ins.field_0.ot = 0x88b;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
        lj_opt_fold(J);
LAB_00150fd5:
        rec_mm_callcomp(J,ix,op);
        bVar4 = true;
      }
      if ((op & 2U) == 0 || bVar4) goto LAB_00150ff2;
LAB_00150f43:
      TVar1 = ix->key;
      ix->tab = TVar1;
      ix->key = ix->val;
      ix->val = TVar1;
      TVar3 = ix->keyv;
      ix->tabv = TVar3;
      ix->keyv = ix->valv;
      ix->valv = TVar3;
      op = op ^ 3;
      bVar4 = true;
    }
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

static void rec_mm_comp(jit_State *J, RecordIndex *ix, int op)
{
  ix->tab = ix->val;
  copyTV(J->L, &ix->tabv, &ix->valv);
  while (1) {
    MMS mm = (op & 2) ? MM_le : MM_lt;  /* Try __le + __lt or only __lt. */
#if LJ_52
    if (!lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      ix->tab = ix->key;
      copyTV(J->L, &ix->tabv, &ix->keyv);
      if (!lj_record_mm_lookup(J, ix, mm))  /* Lookup mm on 2nd operand. */
	goto nomatch;
    }
    rec_mm_callcomp(J, ix, op);
    return;
#else
    if (lj_record_mm_lookup(J, ix, mm)) {  /* Lookup mm on 1st operand. */
      cTValue *bv;
      TRef mo1 = ix->mobj;
      TValue mo1v;
      copyTV(J->L, &mo1v, &ix->mobjv);
      /* Avoid the 2nd lookup and the objcmp if the metatables are equal. */
      bv = &ix->keyv;
      if (tvistab(bv) && tabref(tabV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_TAB_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else if (tvisudata(bv) && tabref(udataV(bv)->metatable) == ix->mtv) {
	TRef mt2 = emitir(IRT(IR_FLOAD, IRT_TAB), ix->key, IRFL_UDATA_META);
	emitir(IRTG(IR_EQ, IRT_TAB), mt2, ix->mt);
      } else {  /* Lookup metamethod on 2nd operand and compare both. */
	ix->tab = ix->key;
	copyTV(J->L, &ix->tabv, bv);
	if (!lj_record_mm_lookup(J, ix, mm) ||
	    lj_record_objcmp(J, mo1, ix->mobj, &mo1v, &ix->mobjv))
	  goto nomatch;
      }
      rec_mm_callcomp(J, ix, op);
      return;
    }
#endif
  nomatch:
    /* Lookup failed. Retry with  __lt and swapped operands. */
    if (!(op & 2)) break;  /* Already at __lt. Interpreter will throw. */
    ix->tab = ix->key; ix->key = ix->val; ix->val = ix->tab;
    copyTV(J->L, &ix->tabv, &ix->keyv);
    copyTV(J->L, &ix->keyv, &ix->valv);
    copyTV(J->L, &ix->valv, &ix->tabv);
    op ^= 3;
  }
}